

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O3

Real __thiscall amrex::MLMG::MLResNormInf(MLMG *this,int alevmax,bool local)

{
  uint uVar1;
  long lVar2;
  double extraout_XMM0_Qa;
  double dVar3;
  double dVar4;
  
  if (-1 < alevmax) {
    lVar2 = 0;
    uVar1 = 0;
    dVar4 = 0.0;
    do {
      (*this->linop->_vptr_MLLinOp[0x33])
                (this->linop,(ulong)uVar1,
                 *(undefined8 *)
                  ((long)&(((this->res).
                            super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                          super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar2),1);
      dVar3 = extraout_XMM0_Qa;
      if (extraout_XMM0_Qa <= dVar4) {
        dVar3 = dVar4;
      }
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x18;
      dVar4 = dVar3;
    } while ((ulong)(uint)alevmax * 0x18 + 0x18 != lVar2);
    return dVar3;
  }
  return 0.0;
}

Assistant:

Real
MLMG::MLResNormInf (int alevmax, bool local)
{
    BL_PROFILE("MLMG::MLResNormInf()");
    Real r = 0.0;
    for (int alev = 0; alev <= alevmax; ++alev)
    {
        r = std::max(r, ResNormInf(alev,true));
    }
    if (!local) ParallelAllReduce::Max(r, ParallelContext::CommunicatorSub());
    return r;
}